

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

UdpBodySyntax * __thiscall slang::parsing::Parser::parseUdpBody(Parser *this,bool isSequential)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  span<slang::syntax::UdpEntrySyntax_*,_18446744073709551615UL> elements_00;
  Token name_00;
  Token table_00;
  Token initial_00;
  Token endtable_00;
  Token equals_00;
  Token semi_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  UdpBodySyntax *pUVar4;
  EVP_PKEY_CTX *src;
  byte in_SIL;
  undefined8 *in_RDI;
  Token TVar5;
  Token TVar6;
  Token endtable;
  Token current_1;
  SmallVector<slang::syntax::UdpEntrySyntax_*,_5UL> entries;
  Token table;
  Token semi;
  ExpressionSyntax *expr;
  Token equals;
  Token name;
  Token keyword;
  UdpInitialStmtSyntax *initial;
  Token current;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> portDecls;
  ParserBase *in_stack_fffffffffffffb78;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffb80;
  Token TVar7;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *this_00;
  undefined6 in_stack_fffffffffffffb88;
  TokenKind in_stack_fffffffffffffb8e;
  ParserBase *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  ParserBase *in_stack_fffffffffffffba0;
  UdpInitialStmtSyntax *pUVar8;
  undefined8 in_stack_fffffffffffffba8;
  Info *in_stack_fffffffffffffbb0;
  Info *pIVar9;
  undefined8 in_stack_fffffffffffffbc0;
  Info *in_stack_fffffffffffffbc8;
  undefined8 in_stack_fffffffffffffbd0;
  Info *in_stack_fffffffffffffbd8;
  undefined8 in_stack_fffffffffffffc08;
  TokenKind kind;
  undefined7 in_stack_fffffffffffffc10;
  undefined1 in_stack_fffffffffffffc17;
  ParserBase *in_stack_fffffffffffffc48;
  ExpressionSyntax *in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffd8f;
  Parser *in_stack_fffffffffffffd90;
  Token local_240;
  UdpEntrySyntax *local_230;
  Token local_228;
  Token local_218;
  SmallVectorBase<slang::syntax::UdpEntrySyntax_*> local_208;
  Parser *in_stack_fffffffffffffe20;
  bitmask<slang::parsing::detail::ExpressionOptions> in_stack_fffffffffffffe2c;
  bool *in_stack_fffffffffffffe90;
  Parser *in_stack_fffffffffffffe98;
  bitmask<slang::parsing::detail::ExpressionOptions> local_15c;
  ExpressionSyntax *local_158;
  Token local_150;
  Token local_140;
  Token local_130;
  UdpInitialStmtSyntax *local_120;
  undefined4 local_118;
  undefined2 local_114;
  undefined4 local_10e;
  undefined2 local_10a;
  Token local_108;
  Token local_f8;
  Token local_b8 [2];
  Token local_98;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_88 [2];
  byte local_9;
  undefined8 uVar3;
  
  local_9 = in_SIL & 1;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8e28a8);
  while( true ) {
    TVar5 = ParserBase::peek(in_stack_fffffffffffffb78);
    local_98.kind = TVar5.kind;
    bVar1 = slang::syntax::SyntaxFacts::isPossibleUdpPort(local_98.kind);
    local_98 = TVar5;
    if (!bVar1) break;
    TVar5 = ParserBase::peek(in_stack_fffffffffffffb78);
    local_b8[0] = TVar5;
    parseUdpPortDecl(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    slang::syntax::TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_fffffffffffffb80,(SyntaxNode *)in_stack_fffffffffffffb78);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
              (in_stack_fffffffffffffb80,(TokenOrSyntax *)in_stack_fffffffffffffb78);
    TVar5 = ParserBase::expect((ParserBase *)
                               CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                               SUB82(in_stack_fffffffffffffc08,6));
    TVar6.rawLen._2_2_ = in_stack_fffffffffffffb8e;
    TVar6._0_6_ = in_stack_fffffffffffffb88;
    TVar6.info = (Info *)in_stack_fffffffffffffb90;
    local_f8 = TVar5;
    slang::syntax::TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_stack_fffffffffffffb80,TVar6);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
              (in_stack_fffffffffffffb80,(TokenOrSyntax *)in_stack_fffffffffffffb78);
    TVar5 = ParserBase::peek(in_stack_fffffffffffffb78);
    local_108 = TVar5;
    bVar1 = Token::operator==(local_b8,&local_108);
    if (bVar1) {
      std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)0x8e2a8a);
      local_114 = local_10a;
      local_118 = local_10e;
      ParserBase::skipToken
                (in_stack_fffffffffffffc48,
                 (_Optional_base<slang::DiagCode,_true,_true>)
                 SUB86((ulong)in_stack_fffffffffffffc50 >> 0x10,0));
    }
  }
  local_120 = (UdpInitialStmtSyntax *)0x0;
  bVar1 = ParserBase::peek(in_stack_fffffffffffffb90,in_stack_fffffffffffffb8e);
  TVar7.info = (Info *)in_stack_fffffffffffffb80;
  TVar7._0_8_ = in_stack_fffffffffffffb78;
  TVar5.info = (Info *)in_stack_fffffffffffffb90;
  TVar5._0_8_ = in_stack_fffffffffffffc48;
  if (bVar1) {
    local_130 = ParserBase::consume(in_stack_fffffffffffffba0);
    local_140 = ParserBase::expect((ParserBase *)
                                   CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                                   SUB82(in_stack_fffffffffffffc08,6));
    local_150 = ParserBase::expect((ParserBase *)
                                   CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                                   SUB82(in_stack_fffffffffffffc08,6));
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask(&local_15c,None);
    in_stack_fffffffffffffc50 =
         parsePrimaryExpression(in_stack_fffffffffffffe20,in_stack_fffffffffffffe2c);
    local_158 = in_stack_fffffffffffffc50;
    TVar5 = ParserBase::expect((ParserBase *)
                               CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                               SUB82(in_stack_fffffffffffffc08,6));
    in_stack_fffffffffffffb88 = TVar5._0_6_;
    in_stack_fffffffffffffb8e = TVar5.rawLen._2_2_;
    initial_00.info = in_stack_fffffffffffffbb0;
    initial_00.kind = (short)in_stack_fffffffffffffba8;
    initial_00._2_1_ = (char)((ulong)in_stack_fffffffffffffba8 >> 0x10);
    initial_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffba8 >> 0x18);
    initial_00.rawLen = (int)((ulong)in_stack_fffffffffffffba8 >> 0x20);
    name_00.info = (Info *)in_stack_fffffffffffffba0;
    name_00.kind = (short)in_stack_fffffffffffffb98;
    name_00._2_1_ = (char)((ulong)in_stack_fffffffffffffb98 >> 0x10);
    name_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb98 >> 0x18);
    name_00.rawLen = (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
    equals_00.info = in_stack_fffffffffffffbc8;
    equals_00.kind = (short)in_stack_fffffffffffffbc0;
    equals_00._2_1_ = (char)((ulong)in_stack_fffffffffffffbc0 >> 0x10);
    equals_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffbc0 >> 0x18);
    equals_00.rawLen = (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
    semi_00.info = in_stack_fffffffffffffbd8;
    semi_00.kind = (short)in_stack_fffffffffffffbd0;
    semi_00._2_1_ = (char)((ulong)in_stack_fffffffffffffbd0 >> 0x10);
    semi_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffbd0 >> 0x18);
    semi_00.rawLen = (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
    TVar7 = local_150;
    local_120 = slang::syntax::SyntaxFactory::udpInitialStmt
                          ((SyntaxFactory *)TVar5.info,initial_00,name_00,equals_00,TVar5._0_8_,
                           semi_00);
  }
  ParserBase::expect((ParserBase *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                     SUB82(in_stack_fffffffffffffc08,6));
  SmallVector<slang::syntax::UdpEntrySyntax_*,_5UL>::SmallVector
            ((SmallVector<slang::syntax::UdpEntrySyntax_*,_5UL> *)0x8e2d6e);
  while( true ) {
    kind = SUB82(in_stack_fffffffffffffc08,6);
    TVar6 = ParserBase::peek(TVar7._0_8_);
    local_218.kind = TVar6.kind;
    bVar1 = slang::syntax::SyntaxFacts::isPossibleUdpEntry(local_218.kind);
    local_218 = TVar6;
    if (!bVar1) break;
    TVar6 = ParserBase::peek(TVar7._0_8_);
    local_228.info = TVar6.info;
    in_stack_fffffffffffffc08 = TVar6._0_8_;
    local_228._0_8_ = in_stack_fffffffffffffc08;
    local_230 = parseUdpEntry(in_stack_fffffffffffffd90,(bool)in_stack_fffffffffffffd8f);
    SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::push_back
              ((SmallVectorBase<slang::syntax::UdpEntrySyntax_*> *)TVar7.info,TVar7._0_8_);
    TVar6 = ParserBase::peek(TVar7._0_8_);
    local_240 = TVar6;
    bVar1 = Token::operator==(&local_228,&local_240);
    if (bVar1) {
      std::optional<slang::DiagCode>::optional((optional<slang::DiagCode> *)0x8e2ec0);
      ParserBase::skipToken
                (TVar5._0_8_,
                 (_Optional_base<slang::DiagCode,_true,_true>)
                 SUB86((ulong)in_stack_fffffffffffffc50 >> 0x10,0));
    }
  }
  TVar6 = ParserBase::expect((ParserBase *)CONCAT17(bVar1,in_stack_fffffffffffffc10),kind);
  pIVar9 = (Info *)(in_RDI + 0x1c);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (local_88,(EVP_PKEY_CTX *)*in_RDI,(EVP_PKEY_CTX *)TVar6._0_8_);
  this_00 = (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)TVar7.info;
  elements._M_ptr._6_2_ = in_stack_fffffffffffffb8e;
  elements._M_ptr._0_6_ = in_stack_fffffffffffffb88;
  elements._M_extent._M_extent_value = (size_t)TVar5.info;
  slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::SeparatedSyntaxList
            (this_00,elements);
  pUVar8 = local_120;
  iVar2 = SmallVectorBase<slang::syntax::UdpEntrySyntax_*>::copy
                    (&local_208,(EVP_PKEY_CTX *)*in_RDI,src);
  uVar3 = CONCAT44(extraout_var,iVar2);
  elements_00._M_ptr._6_2_ = in_stack_fffffffffffffb8e;
  elements_00._M_ptr._0_6_ = in_stack_fffffffffffffb88;
  elements_00._M_extent._M_extent_value = (size_t)TVar5.info;
  slang::syntax::SyntaxList<slang::syntax::UdpEntrySyntax>::SyntaxList
            ((SyntaxList<slang::syntax::UdpEntrySyntax> *)this_00,elements_00);
  table_00.info = (Info *)pUVar8;
  table_00.kind = (short)in_stack_fffffffffffffb98;
  table_00._2_1_ = (char)((ulong)in_stack_fffffffffffffb98 >> 0x10);
  table_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffb98 >> 0x18);
  table_00.rawLen = (int)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  endtable_00.info = pIVar9;
  endtable_00.kind = (short)uVar3;
  endtable_00._2_1_ = (char)((ulong)uVar3 >> 0x10);
  endtable_00.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  endtable_00.rawLen = (int)((ulong)uVar3 >> 0x20);
  pUVar4 = slang::syntax::SyntaxFactory::udpBody
                     ((SyntaxFactory *)TVar5.info,
                      (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)
                      CONCAT26(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88),
                      (UdpInitialStmtSyntax *)TVar6.info,table_00,TVar6._0_8_,endtable_00);
  SmallVector<slang::syntax::UdpEntrySyntax_*,_5UL>::~SmallVector
            ((SmallVector<slang::syntax::UdpEntrySyntax_*,_5UL> *)0x8e30b0);
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8e30bd);
  return pUVar4;
}

Assistant:

UdpBodySyntax& Parser::parseUdpBody(bool isSequential) {
    SmallVector<TokenOrSyntax, 4> portDecls;
    while (isPossibleUdpPort(peek().kind)) {
        auto current = peek();
        portDecls.push_back(&parseUdpPortDecl(isSequential));
        portDecls.push_back(expect(TokenKind::Semicolon));

        if (current == peek()) {
            // We didn't consume any tokens, so we're looking at
            // something invalid.
            skipToken({});
        }
    }

    UdpInitialStmtSyntax* initial = nullptr;
    if (peek(TokenKind::InitialKeyword)) {
        auto keyword = consume();
        auto name = expect(TokenKind::Identifier);
        auto equals = expect(TokenKind::Equals);
        auto& expr = parsePrimaryExpression(ExpressionOptions::None);
        auto semi = expect(TokenKind::Semicolon);
        initial = &factory.udpInitialStmt(keyword, name, equals, expr, semi);
    }

    auto table = expect(TokenKind::TableKeyword);

    SmallVector<UdpEntrySyntax*> entries;
    while (isPossibleUdpEntry(peek().kind)) {
        auto current = peek();
        entries.push_back(&parseUdpEntry(isSequential));

        if (current == peek()) {
            // We didn't consume any tokens, so we're looking at
            // something invalid.
            skipToken({});
        }
    }

    auto endtable = expect(TokenKind::EndTableKeyword);
    return factory.udpBody(portDecls.copy(alloc), initial, table, entries.copy(alloc), endtable);
}